

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bsreadlna(bstring r,bStream *s,char terminator)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_50 [8];
  tagbstring x;
  char *b;
  int rlo;
  int ret;
  int l;
  int i;
  char terminator_local;
  bStream *s_local;
  bstring r_local;
  
  if ((((s == (bStream *)0x0) || (s->buff == (bstring)0x0)) || (r == (bstring)0x0)) ||
     (((r->mlen < 1 || (r->slen < 0)) || (r->mlen < r->slen)))) {
    r_local._4_4_ = -1;
  }
  else {
    iVar2 = s->buff->slen;
    iVar1 = balloc(s->buff,s->maxBuffSz + 1);
    if (iVar1 == 0) {
      x._0_8_ = s->buff->data;
      *(char *)(x._0_8_ + (long)iVar2) = terminator;
      for (ret = 0; *(uchar *)(x._0_8_ + (long)ret) != terminator; ret = ret + 1) {
      }
      x.data = (uchar *)x._0_8_;
      if (ret < iVar2) {
        local_50._4_4_ = ret + 1;
        iVar1 = bconcat(r,(const_bstring)local_50);
        s->buff->slen = iVar2;
        if (iVar1 == 0) {
          bdelete(s->buff,0,ret + 1);
        }
        r_local._4_4_ = 0;
      }
      else {
        iVar1 = r->slen;
        local_50._4_4_ = iVar2;
        iVar2 = bconcat(r,(const_bstring)local_50);
        if (iVar2 == 0) {
          while (iVar2 = balloc(r,r->slen + s->maxBuffSz + 1), iVar2 == 0) {
            x.data = r->data + r->slen;
            sVar3 = (*s->readFnPtr)(x.data,1,(long)s->maxBuffSz,s->parm);
            iVar2 = (int)sVar3;
            if (iVar2 < 1) {
              r->data[r->slen] = '\0';
              s->buff->slen = 0;
              s->isEOF = 1;
              return -(uint)(r->slen == iVar1);
            }
            x.data[iVar2] = terminator;
            for (ret = 0; x.data[ret] != terminator; ret = ret + 1) {
            }
            if (ret < iVar2) {
              iVar1 = ret + 1;
              r->slen = iVar1 + r->slen;
              s->buff->slen = iVar2 - iVar1;
              memcpy(s->buff->data,x.data + iVar1,(long)(iVar2 - iVar1));
              r->data[r->slen] = '\0';
              return 0;
            }
            r->slen = iVar2 + r->slen;
          }
          r_local._4_4_ = -1;
        }
        else {
          r_local._4_4_ = -1;
        }
      }
    }
    else {
      r_local._4_4_ = -1;
    }
  }
  return r_local._4_4_;
}

Assistant:

int bsreadlna (bstring r, struct bStream * s, char terminator) {
int i, l, ret, rlo;
char * b;
struct tagbstring x;

	if (s == NULL || s->buff == NULL || r == NULL || r->mlen <= 0 ||
	    r->slen < 0 || r->mlen < r->slen) return BSTR_ERR;
	l = s->buff->slen;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	b = (char *) s->buff->data;
	x.data = (unsigned char *) b;

	/* First check if the current buffer holds the terminator */
	b[l] = terminator; /* Set sentinel */
	for (i=0; b[i] != terminator; i++) ;
	if (i < l) {
		x.slen = i + 1;
		ret = bconcat (r, &x);
		s->buff->slen = l;
		if (BSTR_OK == ret) bdelete (s->buff, 0, i + 1);
		return BSTR_OK;
	}

	rlo = r->slen;

	/* If not then just concatenate the entire buffer to the output */
	x.slen = l;
	if (BSTR_OK != bconcat (r, &x)) return BSTR_ERR;

	/* Perform direct in-place reads into the destination to allow for
	   the minimum of data-copies */
	for (;;) {
		if (BSTR_OK != balloc (r, r->slen + s->maxBuffSz + 1))
		    return BSTR_ERR;
		b = (char *) (r->data + r->slen);
		l = (int) s->readFnPtr (b, 1, s->maxBuffSz, s->parm);
		if (l <= 0) {
			r->data[r->slen] = (unsigned char) '\0';
			s->buff->slen = 0;
			s->isEOF = 1;
			/* If nothing was read return with an error message */
			return BSTR_ERR & -(r->slen == rlo);
		}
		b[l] = terminator; /* Set sentinel */
		for (i=0; b[i] != terminator; i++) ;
		if (i < l) break;
		r->slen += l;
	}

	/* Terminator found, push over-read back to buffer */
	i++;
	r->slen += i;
	s->buff->slen = l - i;
	bstr__memcpy (s->buff->data, b + i, l - i);
	r->data[r->slen] = (unsigned char) '\0';
	return BSTR_OK;
}